

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

string * __thiscall
onmt::Tokenizer::mode_to_str_abi_cxx11_(string *__return_storage_ptr__,Tokenizer *this,Mode mode)

{
  invalid_argument *this_00;
  undefined4 in_register_00000014;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "conservative";
    __a = &local_13;
    break;
  case 1:
    __s = "aggressive";
    __a = &local_11;
    break;
  case 2:
    __s = "char";
    __a = &local_12;
    break;
  case 3:
    __s = "space";
    __a = &local_15;
    break;
  case 4:
    __s = "none";
    __a = &local_14;
    break;
  default:
    this_00 = (invalid_argument *)
              __cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,mode));
    std::invalid_argument::invalid_argument(this_00,"invalid tokenization mode");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::mode_to_str(const Mode mode)
  {
    switch (mode)
    {
    case Mode::Aggressive:
      return "aggressive";
    case Mode::Char:
      return "char";
    case Mode::Conservative:
      return "conservative";
    case Mode::None:
      return "none";
    case Mode::Space:
      return "space";
    }
    throw std::invalid_argument("invalid tokenization mode");
  }